

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseEnumeratedType(xmlParserCtxtPtr ctxt,xmlEnumerationPtr *tree)

{
  int iVar1;
  xmlEnumerationPtr pxVar2;
  xmlEnumerationPtr *tree_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (((((*ctxt->input->cur == 'N') && (ctxt->input->cur[1] == 'O')) && (ctxt->input->cur[2] == 'T')
       ) && ((ctxt->input->cur[3] == 'A' && (ctxt->input->cur[4] == 'T')))) &&
     ((ctxt->input->cur[5] == 'I' && ((ctxt->input->cur[6] == 'O' && (ctxt->input->cur[7] == 'N'))))
     )) {
    ctxt->input->cur = ctxt->input->cur + 8;
    ctxt->input->col = ctxt->input->col + 8;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    iVar1 = xmlSkipBlankCharsPE(ctxt);
    if (iVar1 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'NOTATION\'\n");
      ctxt_local._4_4_ = 0;
    }
    else {
      pxVar2 = xmlParseNotationType(ctxt);
      *tree = pxVar2;
      if (*tree == (xmlEnumerationPtr)0x0) {
        ctxt_local._4_4_ = 0;
      }
      else {
        ctxt_local._4_4_ = 10;
      }
    }
  }
  else {
    pxVar2 = xmlParseEnumerationType(ctxt);
    *tree = pxVar2;
    if (*tree == (xmlEnumerationPtr)0x0) {
      ctxt_local._4_4_ = 0;
    }
    else {
      ctxt_local._4_4_ = 9;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseEnumeratedType(xmlParserCtxtPtr ctxt, xmlEnumerationPtr *tree) {
    if (CMP8(CUR_PTR, 'N', 'O', 'T', 'A', 'T', 'I', 'O', 'N')) {
	SKIP(8);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after 'NOTATION'\n");
	    return(0);
	}
	*tree = xmlParseNotationType(ctxt);
	if (*tree == NULL) return(0);
	return(XML_ATTRIBUTE_NOTATION);
    }
    *tree = xmlParseEnumerationType(ctxt);
    if (*tree == NULL) return(0);
    return(XML_ATTRIBUTE_ENUMERATION);
}